

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall Flood_Two_Test::TestBody(Flood_Two_Test *this)

{
  bool bVar1;
  pointer ptr;
  const_reference matchers;
  const_reference matchers_1;
  char *message;
  _Tuple_impl<0UL,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  in_stack_ffffffffffffff60;
  AssertHelper local_60;
  Message local_58 [3];
  testing local_40 [11];
  char local_35 [5];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Flood_Two_Test *this_local;
  
  ptr = std::array<unsigned_char,_5UL>::data(&(this->super_Flood).buffer_);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       pstore::gsl::make_span<unsigned_char>(ptr,2);
  pstore::serialize::flood<_1l>((span<unsigned_char,__1L>)join_0x00000010_0x00000000_);
  matchers = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::Flood::expected_,0);
  matchers_1 = std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::Flood::expected_,1);
  testing::ElementsAre<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>
            (local_40,matchers,matchers_1,"","","");
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>>>
            ((ElementsAreMatcher<std::tuple<unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>_>
              )in_stack_ffffffffffffff60);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char,unsigned_char,unsigned_char,unsigned_char>>>
  ::operator()((AssertionResult *)local_30,local_35,(array<unsigned_char,_5UL> *)"buffer_");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x183,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_F (Flood, Two) {
    pstore::serialize::flood (pstore::gsl::make_span (buffer_.data (), 2U));
    EXPECT_THAT (buffer_, ::testing::ElementsAre (expected_[0], expected_[1], zero_, zero_, zero_));
}